

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Gia_VtaPrintMemory(Vta_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int level;
  sat_solver2 *s;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  iVar1 = p->pGia->nObjs;
  dVar9 = sat_solver2_memory(p->pSat,1);
  s = p->pSat;
  dVar10 = sat_solver2_memory_proof(s);
  pVVar2 = p->vFrames;
  dVar12 = 0.0;
  dVar11 = 0.0;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    dVar11 = (double)pVVar2->nCap * 8.0 + 16.0;
    if (0 < (long)pVVar2->nSize) {
      lVar7 = 0;
      do {
        s = (sat_solver2 *)pVVar2->pArray[lVar7];
        if (s != (sat_solver2 *)0x0) {
          dVar11 = dVar11 + (double)s->size * 4.0 + 16.0;
        }
        lVar7 = lVar7 + 1;
      } while (pVVar2->nSize != lVar7);
    }
  }
  level = (int)s;
  pVVar2 = p->vCores;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    dVar12 = (double)pVVar2->nCap * 8.0 + 16.0;
    level = pVVar2->nSize;
    if (0 < (long)level) {
      lVar7 = 0;
      do {
        if ((int *)pVVar2->pArray[lVar7] != (int *)0x0) {
          dVar12 = dVar12 + (double)*pVVar2->pArray[lVar7] * 4.0 + 16.0;
        }
        lVar7 = lVar7 + 1;
      } while (level != lVar7);
    }
  }
  lVar8 = (long)p->vOrder->nCap << 2;
  auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar15._0_8_ = lVar8;
  auVar15._12_4_ = 0x45300000;
  lVar6 = (long)p->vSeenGla->nCap << 2;
  auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar16._0_8_ = lVar6;
  auVar16._12_4_ = 0x45300000;
  lVar7 = (long)p->nObjsAlloc * 0x10 + (long)p->nBins * 4;
  auVar17._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar17._0_8_ = lVar7;
  auVar17._12_4_ = 0x45300000;
  dVar20 = (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  lVar7 = (long)iVar1 * 0xc;
  auVar18._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar18._0_8_ = lVar7;
  auVar18._12_4_ = 0x45300000;
  dVar5 = (auVar18._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  lVar7 = (long)p->vAddedNew->nCap << 2;
  auVar19._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar19._0_8_ = lVar7;
  auVar19._12_4_ = 0x45300000;
  dVar13 = (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
           (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
           (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + 168.0 + dVar11 + dVar12;
  dVar12 = dVar9 + dVar5 + dVar10 + dVar20 + dVar13;
  Abc_Print(level,"%s =","Memory: AIG     ");
  bVar3 = NAN(dVar12);
  bVar4 = dVar12 == 0.0;
  dVar11 = (dVar5 * 100.0) / dVar12;
  if ((bVar4) && (!bVar3)) {
    dVar11 = 0.0;
  }
  dVar14 = (dVar9 * 100.0) / dVar12;
  if ((bVar4) && (!bVar3)) {
    dVar14 = 0.0;
  }
  dVar22 = (dVar10 * 100.0) / dVar12;
  if ((bVar4) && (!bVar3)) {
    dVar22 = 0.0;
  }
  dVar23 = (dVar20 * 100.0) / dVar12;
  if ((bVar4) && (!bVar3)) {
    dVar23 = 0.0;
  }
  dVar24 = (dVar13 * 100.0) / dVar12;
  if ((bVar4) && (!bVar3)) {
    dVar24 = 0.0;
  }
  dVar21 = (dVar12 * 100.0) / dVar12;
  if ((bVar4) && (!bVar3)) {
    dVar21 = 0.0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar5 * 9.5367431640625e-07,dVar11);
  Abc_Print(level,"%s =","Memory: SAT     ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar9 * 9.5367431640625e-07,dVar14);
  Abc_Print(level,"%s =","Memory: Proof   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar10 * 9.5367431640625e-07,dVar22);
  Abc_Print(level,"%s =","Memory: Map     ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar20 * 9.5367431640625e-07,dVar23);
  Abc_Print(level,"%s =","Memory: Other   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar13 * 9.5367431640625e-07,dVar24);
  Abc_Print(level,"%s =","Memory: TOTAL   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar12 * 9.5367431640625e-07,dVar21);
  return;
}

Assistant:

void Gia_VtaPrintMemory( Vta_Man_t * p )
{
    double memTot = 0;
    double memAig = Gia_ManObjNum(p->pGia) * sizeof(Gia_Obj_t);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = p->nObjsAlloc * sizeof(Vta_Obj_t) + p->nBins * sizeof(int);
    double memOth = sizeof(Vta_Man_t);
    memOth += Vec_IntCap(p->vOrder) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vFrames );
    memOth += Vec_BitCap(p->vSeenGla) * sizeof(int);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCores );
    memOth += Vec_IntCap(p->vAddedNew) * sizeof(int);
    memTot = memAig + memSat + memPro + memMap + memOth;
    ABC_PRMP( "Memory: AIG     ", memAig, memTot );
    ABC_PRMP( "Memory: SAT     ", memSat, memTot );
    ABC_PRMP( "Memory: Proof   ", memPro, memTot );
    ABC_PRMP( "Memory: Map     ", memMap, memTot );
    ABC_PRMP( "Memory: Other   ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL   ", memTot, memTot );
}